

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

void enumerate_ints(MAFSA_automaton ma,MAFSA_stack_struct *ptr_stack,uint32_t cstate,
                   MAFSA_automaton_string_handler fetcher,void *user_data)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((int)cstate < 0) {
    (*fetcher)(user_data,ptr_stack->buffer,ptr_stack->current + 1);
  }
  uVar4 = cstate & 0x7fffffff;
  puVar2 = ma->ptr_links + uVar4;
  while( true ) {
    uVar4 = uVar4 + 1;
    uVar1 = *puVar2;
    if (uVar1 == 0xff000000) break;
    uVar3 = ptr_stack->current + 1;
    if (uVar3 < ptr_stack->reserved) {
      ptr_stack->current = uVar3;
      ptr_stack->buffer[uVar3] = (MAFSA_letter)(uVar1 >> 0x18);
    }
    enumerate_ints(ma,ptr_stack,ma->ptr_nodes[uVar1 & 0xffffff],fetcher,user_data);
    if (-1 < ptr_stack->current) {
      ptr_stack->current = ptr_stack->current + -1;
    }
    puVar2 = ma->ptr_links + uVar4;
  }
  return;
}

Assistant:

static void enumerate_ints(const MAFSA_automaton ma, struct MAFSA_stack_struct *ptr_stack,
    uint32_t cstate, MAFSA_automaton_string_handler fetcher, void *user_data)
{
    uint32_t links_begin, child, where;

    if (node_is_final(cstate))
    {
        fetcher(user_data, ptr_stack->buffer, stack_size(ptr_stack));
    }

    links_begin = node_get_children_start(cstate);

    for (child = ma->ptr_links[links_begin]; !link_is_terminating(child); child = ma->ptr_links[++links_begin])
    {
        stack_push(ptr_stack, link_get_label(child));

        where = link_get_link(child);

        enumerate_ints(ma, ptr_stack, ma->ptr_nodes[where], fetcher, user_data);

        stack_pop(ptr_stack);
    }
}